

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

bool __thiscall Js::PathTypeHandlerBase::HasAnyFixedProperties(PathTypeHandlerBase *this)

{
  ushort uVar1;
  PropertyIndex PVar2;
  bool bVar3;
  PropertyIndex index;
  bool bVar4;
  
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
  bVar4 = 1 < uVar1;
  if (bVar4) {
    uVar1 = uVar1 >> 1;
    bVar3 = TypePath::GetIsFixedFieldAt((this->typePath).ptr,0,(uint)uVar1);
    if (!bVar3) {
      PVar2 = 1;
      do {
        index = PVar2;
        if (uVar1 == index) break;
        bVar4 = TypePath::GetIsFixedFieldAt((this->typePath).ptr,index,(uint)uVar1);
        PVar2 = index + 1;
      } while (!bVar4);
      bVar4 = index < uVar1;
    }
  }
  return bVar4;
}

Assistant:

bool PathTypeHandlerBase::HasAnyFixedProperties() const
    {
        int pathLength = GetPathLength();
        for (PropertyIndex i = 0; i < pathLength; i++)
        {
            if (this->GetTypePath()->GetIsFixedFieldAt(i, pathLength))
            {
                return true;
            }
        }
        return false;
    }